

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

config_value *
parser_resolve_array_values(parser *parser,char **value_items,size_t value_items_length)

{
  config_value *value;
  config_value *pcVar1;
  size_t j;
  size_t sVar2;
  
  value = config_value_create_array(value_items_length);
  if (value == (config_value *)0x0) {
LAB_001075c4:
    value = (config_value *)0x0;
  }
  else if (value_items_length != 0) {
    sVar2 = 0;
    do {
      pcVar1 = parser_parse_value(parser,value_items[sVar2]);
      if (pcVar1 == (config_value *)0x0) {
        if (sVar2 < value_items_length) {
          do {
            free(value_items[sVar2]);
            sVar2 = sVar2 + 1;
          } while (value_items_length != sVar2);
        }
        config_value_destroy(value);
        goto LAB_001075c4;
      }
      ((value->data).array)->values[sVar2] = pcVar1;
      sVar2 = sVar2 + 1;
    } while (value_items_length != sVar2);
  }
  return value;
}

Assistant:

static struct config_value *parser_resolve_array_values(struct parser *parser, char **value_items,
                                                        size_t value_items_length)
{
        struct config_value *config_value = config_value_create_array(value_items_length);

        if (config_value == NULL) {
                return NULL;
        }

        // Resolve and insert config_values into the array
        for (size_t i = 0; i < value_items_length; ++i) {
                struct config_value *item = parser_parse_value(parser, value_items[i]);

                if (item == NULL) {
                        for (size_t j = i; j < value_items_length; ++j) {
                                free(value_items[j]);
                        }

                        config_value_destroy(config_value);

                        return NULL;
                }

                config_value->data.array->values[i] = item;
        }

        return config_value;
}